

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# changesoplex.hpp
# Opt level: O0

void __thiscall
soplex::SPxSolverBase<double>::changeRange
          (SPxSolverBase<double> *this,int i,double *newLhs,double *newRhs,bool scale)

{
  bool bVar1;
  SPxStatus SVar2;
  double *pdVar3;
  double *pdVar4;
  element_type *this_00;
  SPxLPBase<double> *in_RCX;
  uint in_ESI;
  SPxSolverBase<double> *in_RDI;
  undefined1 in_R8B;
  double oldRhs;
  double oldLhs;
  undefined4 in_stack_ffffffffffffffa8;
  uint uVar5;
  int in_stack_ffffffffffffffac;
  double dVar6;
  bool scale_00;
  undefined3 in_stack_ffffffffffffffdc;
  
  uVar5 = CONCAT13(in_R8B,in_stack_ffffffffffffffdc) & 0x1ffffff;
  pdVar3 = SPxLPBase<double>::lhs(&in_RDI->super_SPxLPBase<double>,in_stack_ffffffffffffffac);
  pdVar3 = (double *)*pdVar3;
  pdVar4 = SPxLPBase<double>::rhs(&in_RDI->super_SPxLPBase<double>,in_stack_ffffffffffffffac);
  dVar6 = *pdVar4;
  SPxLPBase<double>::changeLhs(in_RCX,uVar5,pdVar3,SUB81((ulong)dVar6 >> 0x38,0));
  tolerances(in_RDI);
  this_00 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2087b1);
  Tolerances::epsilon(this_00);
  bVar1 = EQ<double,double,double>
                    ((double)in_RDI,
                     (double)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                     1.05330694948493e-317);
  scale_00 = SUB81((ulong)dVar6 >> 0x38,0);
  if (bVar1) {
    SPxLPBase<double>::changeRhs(in_RCX,uVar5,pdVar3,scale_00);
  }
  else {
    SPxLPBase<double>::changeRhs(in_RCX,uVar5,pdVar3,scale_00);
  }
  SVar2 = SPxBasisBase<double>::status(&in_RDI->super_SPxBasisBase<double>);
  if (NO_PROBLEM < SVar2) {
    uVar5 = in_ESI;
    pdVar4 = SPxLPBase<double>::lhs(&in_RDI->super_SPxLPBase<double>,in_stack_ffffffffffffffac);
    (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x6b])
              (*pdVar4,pdVar3,in_RDI,(ulong)uVar5);
    pdVar3 = SPxLPBase<double>::rhs(&in_RDI->super_SPxLPBase<double>,in_ESI);
    (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x6c])
              (*pdVar3,dVar6,in_RDI,(ulong)in_ESI);
    (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x77])();
  }
  return;
}

Assistant:

void SPxSolverBase<R>::changeRange(int i, const R& newLhs, const R& newRhs, bool scale)
{
   R oldLhs = this->lhs(i);
   R oldRhs = this->rhs(i);

   SPxLPBase<R>::changeLhs(i, newLhs, scale);

   if(EQ(newLhs, newRhs, this->tolerances()->epsilon()))
      SPxLPBase<R>::changeRhs(i, newLhs, scale);
   else
      SPxLPBase<R>::changeRhs(i, newRhs, scale);

   if(SPxBasisBase<R>::status() > SPxBasisBase<R>::NO_PROBLEM)
   {
      changeLhsStatus(i, this->lhs(i), oldLhs);
      changeRhsStatus(i, this->rhs(i), oldRhs);
      unInit();
   }
}